

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O2

void __thiscall Minefield::unflag(Minefield *this,int x,int y)

{
  bool bVar1;
  runtime_error *this_00;
  reference rVar2;
  
  checkPos(this,x,y);
  checkRunning(this);
  bVar1 = isOpen(this,x,y);
  if (!bVar1) {
    bVar1 = isFlagged(this,x,y);
    if (bVar1) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((this->flags).
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + x,(long)y);
      *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
      this->flag_cnt = this->flag_cnt + -1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t remove flag on opened field.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Minefield::unflag(int x, int y) {
    checkPos(x, y);
    checkRunning();

    if (isOpen(x, y)) {
        throw std::runtime_error("Can't remove flag on opened field.");
    }

    if (isFlagged(x, y)) {
        flags[x][y] = false;
        flag_cnt--;
    }
}